

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::anon_unknown_2::SamplePosDistributionCase::verifyImage
          (SamplePosDistributionCase *this,Surface *resultImage)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  RenderTarget *pRVar4;
  int *piVar5;
  QualityWarning *this_00;
  float fVar6;
  allocator<char> local_59;
  SampleAverageVerifier verifier;
  string local_40;
  
  if ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.m_renderTarget ==
      TARGET_DEFAULT) {
    pRVar4 = Context::getRenderTarget
                       ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.
                        super_TestCase.m_context);
    piVar5 = &pRVar4->m_numSamples;
  }
  else {
    piVar5 = &(this->super_MultisampleRenderCase).super_MultisampleRenderCase.m_numRequestedSamples;
  }
  iVar1 = *piVar5;
  verifier.super_Verifier._vptr_Verifier = (_func_int **)&PTR_verify_01e499b8;
  verifier.m_isStatisticallySignificant = 3 < iVar1;
  fVar6 = 1.0 / ((float)iVar1 * 12.0);
  verifier.m_numSamples = iVar1;
  if (fVar6 < 0.0) {
    fVar6 = sqrtf(fVar6);
  }
  else {
    fVar6 = SQRT(fVar6);
  }
  verifier.m_distanceThreshold = fVar6 + fVar6;
  local_40._M_dataplus._M_p = (pointer)&PTR_verify_01e49680;
  bVar2 = verifyImageWithVerifier
                    (resultImage,
                     ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase
                      .super_TestCase.super_TestNode.m_testCtx)->m_log,(Verifier *)&local_40,true);
  if ((bVar2) && (3 < iVar1)) {
    bVar3 = verifyImageWithVerifier
                      (resultImage,
                       ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.
                        super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log,
                       &verifier.super_Verifier,true);
    if (!bVar3) {
      this_00 = (QualityWarning *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,
                 "Bias detected, sample positions are not uniformly distributed within the pixel",
                 &local_59);
      MultisampleShaderRenderUtil::QualityWarning::QualityWarning(this_00,&local_40);
      __cxa_throw(this_00,&MultisampleShaderRenderUtil::QualityWarning::typeinfo,
                  tcu::Exception::~Exception);
    }
  }
  return bVar2;
}

Assistant:

bool SamplePosDistributionCase::verifyImage (const tcu::Surface& resultImage)
{
	const int				sampleCount	= (m_renderTarget == TARGET_DEFAULT) ? (m_context.getRenderTarget().getNumSamples()) : (m_numRequestedSamples);
	SampleAverageVerifier	verifier	(sampleCount);

	// check there is nothing in the error channel
	if (!verifyImageWithVerifier(resultImage, m_testCtx.getLog(), NoRedVerifier()))
		return false;

	// position average should be around 0.5, 0.5
	if (verifier.m_isStatisticallySignificant && !verifyImageWithVerifier(resultImage, m_testCtx.getLog(), verifier))
		throw MultisampleShaderRenderUtil::QualityWarning("Bias detected, sample positions are not uniformly distributed within the pixel");

	return true;
}